

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jkGetF0.cc
# Opt level: O2

int sptk::snack::init_dp_f0(double freq,F0_params *par,long *buffsize,long *sdstep,Buffer *buffer)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  frame_rec *pfVar7;
  undefined1 auVar8 [16];
  Frame *pFVar9;
  int *piVar10;
  float *pfVar11;
  Windstat *pWVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  int iVar19;
  double dVar17;
  undefined1 auVar18 [16];
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar23;
  int iVar25;
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  fVar20 = par->trans_amp;
  buffer->tcost = par->trans_cost;
  buffer->tfact_a = fVar20;
  buffer->tfact_s = par->trans_spec;
  fVar20 = par->double_cost;
  buffer->vbias = par->voice_bias;
  buffer->fdouble = fVar20;
  uVar1 = par->frame_step;
  uVar4 = par->wind_dur;
  uVar14 = -(ulong)((double)(float)uVar1 * freq < 0.0);
  uVar15 = -(ulong)((double)(float)uVar4 * freq < 0.0);
  iVar23 = (int)((double)(~uVar14 & 0x3fe0000000000000 | uVar14 & 0xbfe0000000000000) +
                (double)(float)uVar1 * freq);
  iVar25 = (int)((double)(~uVar15 & 0x3fe0000000000000 | uVar15 & 0xbfe0000000000000) +
                (double)(float)uVar4 * freq);
  buffer->step = iVar23;
  buffer->size = iVar25;
  fVar20 = (float)((double)iVar23 / freq);
  buffer->frame_int = fVar20;
  buffer->wdur = (float)((double)iVar25 / freq);
  uVar2 = par->min_f0;
  uVar5 = par->max_f0;
  auVar24._0_8_ = (double)(float)uVar2;
  auVar24._8_8_ = (double)(float)uVar5;
  auVar26._8_8_ = freq;
  auVar26._0_8_ = freq;
  auVar27 = divpd(auVar26,auVar24);
  uVar14 = -(ulong)(auVar27._8_8_ < 0.0);
  uVar15 = -(ulong)(auVar27._0_8_ < 0.0);
  auVar18._0_8_ = ~uVar14 & 0x3fe0000000000000;
  auVar18._8_8_ = ~uVar15 & 0x3fe0000000000000;
  auVar8._8_4_ = 0;
  auVar8._0_8_ = uVar14 & 0xbfe0000000000000;
  auVar8._12_4_ = (uint)(uVar15 >> 0x20) & 0xbfe00000;
  iVar16 = (int)(SUB168(auVar18 | auVar8,0) + auVar27._8_8_);
  iVar19 = (int)(SUB168(auVar18 | auVar8,8) + auVar27._0_8_);
  buffer->start = iVar16;
  buffer->stop = iVar19;
  iVar13 = (iVar19 - iVar16) + 1;
  buffer->nlags = iVar13;
  iVar16 = iVar25 + 1 + iVar19;
  buffer->ncomp = iVar16;
  buffer->maxpeaks = (short)(iVar13 / 2) + 2;
  buffer->ln2 = 0.6931472;
  dVar17 = (double)fVar20;
  auVar21._8_8_ = dVar17;
  auVar21._0_8_ = dVar17;
  auVar27 = divpd(_DAT_00126310,auVar21);
  buffer->size_frame_hist = (int)auVar27._0_8_;
  buffer->size_frame_out = (int)auVar27._8_8_;
  uVar3 = par->lag_weight;
  uVar6 = par->freq_weight;
  auVar22._4_4_ = uVar3;
  auVar22._0_4_ = uVar6;
  auVar22._8_8_ = 0;
  auVar27._4_4_ = (float)iVar19;
  auVar27._0_4_ = fVar20;
  auVar27._8_4_ = (int)((ulong)((double)iVar23 / freq) >> 0x20);
  auVar27._12_4_ = (float)iVar19;
  auVar27 = divps(auVar22,auVar27);
  buffer->freqwt = (float)(int)auVar27._0_8_;
  buffer->lagwt = (float)(int)((ulong)auVar27._0_8_ >> 0x20);
  if (iVar16 < iVar23) {
    iVar19 = (int)(freq * 0.2) / iVar23;
  }
  else {
    iVar19 = ((int)(freq * 0.2) - iVar16) / iVar23 + 1;
  }
  iVar25 = ((int)(freq * 0.02) - (int)(freq * 0.03)) / 2 + (int)(freq * 0.03);
  if (iVar25 <= iVar16) {
    iVar25 = iVar16;
  }
  iVar25 = iVar25 + ((int)(freq * 0.005) + 1) / 2;
  buffer->pad = iVar25;
  *buffsize = (long)(iVar25 + iVar19 * iVar23);
  *sdstep = (long)(iVar19 * iVar23);
  buffer->size_cir_buffer = (int)(1.5 / dVar17);
  pFVar9 = alloc_frame(iVar13,par->n_cands);
  buffer->tailF = pFVar9;
  buffer->headF = pFVar9;
  iVar16 = 1;
  while( true ) {
    iVar13 = buffer->size_cir_buffer;
    if (iVar13 <= iVar16) break;
    pFVar9 = alloc_frame(buffer->nlags,par->n_cands);
    pfVar7 = buffer->headF;
    pfVar7->next = pFVar9;
    pFVar9->prev = pfVar7;
    buffer->headF = pFVar9;
    iVar16 = iVar16 + 1;
  }
  pfVar7 = buffer->tailF;
  pFVar9->next = pfVar7;
  pfVar7->prev = pFVar9;
  buffer->headF = pfVar7;
  if (buffer->pcands == (int *)0x0) {
    piVar10 = (int *)ckalloc((long)par->n_cands << 2);
    buffer->pcands = piVar10;
    iVar13 = buffer->size_cir_buffer;
  }
  buffer->output_buf_size = iVar13;
  pfVar11 = (float *)ckalloc((long)iVar13 << 2);
  buffer->rms_speech = pfVar11;
  pfVar11 = (float *)ckalloc((long)buffer->output_buf_size << 2);
  buffer->f0p = pfVar11;
  pfVar11 = (float *)ckalloc((long)buffer->output_buf_size << 2);
  buffer->vuvp = pfVar11;
  pfVar11 = (float *)ckalloc((long)buffer->output_buf_size << 2);
  buffer->acpkp = pfVar11;
  pfVar11 = (float *)ckalloc((long)buffer->maxpeaks << 2);
  buffer->peaks = pfVar11;
  piVar10 = (int *)ckalloc((long)buffer->maxpeaks << 2);
  buffer->locs = piVar10;
  iVar16 = (int)(freq * 0.02) / buffer->step;
  buffer->wReuse = iVar16;
  if (iVar16 != 0) {
    pWVar12 = (Windstat *)ckalloc((long)iVar16 * 0x19c);
    buffer->windstat = pWVar12;
    uVar15 = 0;
    uVar14 = (ulong)(uint)buffer->wReuse;
    if (buffer->wReuse < 1) {
      uVar14 = uVar15;
    }
    for (; uVar14 * 0x19c - uVar15 != 0; uVar15 = uVar15 + 0x19c) {
      *(undefined8 *)((long)&pWVar12->err + uVar15) = 0;
    }
  }
  if (debug_level != 0) {
    fwrite("done with initialization:\n",0x1a,1,_stderr);
    fprintf(_stderr," size_cir_buffer:%d  xcorr frame size:%d start lag:%d nlags:%d\n",
            (ulong)(uint)buffer->size_cir_buffer,(ulong)(uint)buffer->size,
            (ulong)(uint)buffer->start,(ulong)(uint)buffer->nlags);
  }
  buffer->num_active_frames = 0;
  buffer->first_time = 1;
  return 0;
}

Assistant:

init_dp_f0(double freq, F0_params *par, long *buffsize, long *sdstep, Buffer *buffer)
{
  int nframes;
  int i;
  int stat_wsize, agap, ind, downpatch;
/*
 * reassigning some constants 
 */

  buffer->tcost = par->trans_cost;
  buffer->tfact_a = par->trans_amp;
  buffer->tfact_s = par->trans_spec;
  buffer->vbias = par->voice_bias;
  buffer->fdouble = par->double_cost;
  buffer->frame_int = par->frame_step;
  
  buffer->step = eround(buffer->frame_int * freq);
  buffer->size = eround(par->wind_dur * freq);
  buffer->frame_int = (float)(((float)buffer->step)/freq);
  buffer->wdur = (float)(((float)buffer->size)/freq);
  buffer->start = eround(freq / par->max_f0);
  buffer->stop = eround(freq / par->min_f0);
  buffer->nlags = buffer->stop - buffer->start + 1;
  buffer->ncomp = buffer->size + buffer->stop + 1; /* # of samples required by xcorr
			      comp. per fr. */
  buffer->maxpeaks = 2 + (buffer->nlags/2);	/* maximum number of "peaks" findable in ccf */
  buffer->ln2 = (float)log(2.0);
  buffer->size_frame_hist = (int) (DP_HIST / buffer->frame_int);
  buffer->size_frame_out = (int) (DP_LIMIT / buffer->frame_int);

/*
 * SET UP THE D.P. WEIGHTING FACTORS:
 *      The intent is to make the effectiveness of the various fudge factors
 *      independent of frame rate or sampling frequency.                
 */
  
  /* Lag-dependent weighting factor to emphasize early peaks (higher freqs)*/
  buffer->lagwt = par->lag_weight/buffer->stop;
  
  /* Penalty for a frequency skip in F0 per frame */
  buffer->freqwt = par->freq_weight/buffer->frame_int;
  
  i = (int) (READ_SIZE *freq);
  if(buffer->ncomp >= buffer->step) nframes = ((i-buffer->ncomp)/buffer->step ) + 1;
  else nframes = i / buffer->step;

  /* *buffsize is the number of samples needed to make F0 computation
     of nframes DP frames possible.  The last DP frame is patched with
     enough points so that F0 computation on it can be carried.  F0
     computaion on each frame needs enough points to do

     1) xcross or cross correlation measure:
           enough points to do xcross - ncomp

     2) stationarity measure:
           enough to make 30 msec windowing possible - ind

     3) downsampling:
           enough to make filtering possible -- downpatch
 
     So there are nframes whole DP frames, padded with pad points
     to make the last frame F0 computation ok.

  */

  /* last point in data frame needs points of 1/2 downsampler filter length 
     long, 0.005 is the filter length used in downsampler */
  downpatch = (((int) (freq * 0.005))+1) / 2;

  stat_wsize = (int) (STAT_WSIZE * freq);
  agap = (int) (STAT_AINT * freq);
  ind = ( agap - stat_wsize ) / 2;
  i = stat_wsize + ind;
  buffer->pad = downpatch + ((i>buffer->ncomp) ? i:buffer->ncomp);
  *buffsize = nframes * buffer->step + buffer->pad;
  *sdstep = nframes * buffer->step;
  
  /* Allocate space for the DP storage circularly linked data structure */

  buffer->size_cir_buffer = (int) (DP_CIRCULAR / buffer->frame_int);

  /* creating circularly linked data structures */
  buffer->tailF = alloc_frame(buffer->nlags, par->n_cands);
  buffer->headF = buffer->tailF;

  /* link them up */
  for(i=1; i<buffer->size_cir_buffer; i++){
    buffer->headF->next = alloc_frame(buffer->nlags, par->n_cands);
    buffer->headF->next->prev = buffer->headF;
    buffer->headF = buffer->headF->next;
  }
  buffer->headF->next = buffer->tailF;
  buffer->tailF->prev = buffer->headF;

  buffer->headF = buffer->tailF;

  /* Allocate sscratch array to use during backtrack convergence test. */
  if( ! buffer->pcands ) {
    buffer->pcands = (int *) ckalloc( par->n_cands * sizeof(int));
    /*    spsassert(pcands,"can't allocate pathcands");*/
  }

  /* Allocate arrays to return F0 and related signals. */

  /* Note: remember to compare *vecsize with size_frame_out, because
     size_cir_buffer is not constant */
  buffer->output_buf_size = buffer->size_cir_buffer;
  buffer->rms_speech = (float*)ckalloc(sizeof(float) * buffer->output_buf_size);
  /*  spsassert(rms_speech,"rms_speech ckalloc failed");*/
  buffer->f0p = (float*)ckalloc(sizeof(float) * buffer->output_buf_size);
  /*  spsassert(f0p,"f0p ckalloc failed");*/
  buffer->vuvp = (float*)ckalloc(sizeof(float)* buffer->output_buf_size);
  /*  spsassert(vuvp,"vuvp ckalloc failed");*/
  buffer->acpkp = (float*)ckalloc(sizeof(float) * buffer->output_buf_size);
  /*  spsassert(acpkp,"acpkp ckalloc failed");*/

  /* Allocate space for peak location and amplitude scratch arrays. */
  buffer->peaks = (float*)ckalloc(sizeof(float) * buffer->maxpeaks);
  /*  spsassert(peaks,"peaks ckalloc failed");*/
  buffer->locs = (int*)ckalloc(sizeof(int) * buffer->maxpeaks);
  /*  spsassert(locs, "locs ckalloc failed");*/
  
  /* Initialise the retrieval/saving scheme of window statistic measures */
  buffer->wReuse = agap / buffer->step;
  if (buffer->wReuse){
      buffer->windstat = (Windstat *) ckalloc( buffer->wReuse * sizeof(Windstat));
      /*      spsassert(windstat, "windstat ckalloc failed");*/
      for(i=0; i<buffer->wReuse; i++){
	  buffer->windstat[i].err = 0;
	  buffer->windstat[i].rms = 0;
      }
  }

  if(debug_level){
    Fprintf(stderr, "done with initialization:\n");
    Fprintf(stderr,
	    " size_cir_buffer:%d  xcorr frame size:%d start lag:%d nlags:%d\n",
	    buffer->size_cir_buffer, buffer->size, buffer->start, buffer->nlags);
  }

  buffer->num_active_frames = 0;
  buffer->first_time = 1;

  return(0);
}